

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateExternalFunction
          (JavascriptLibrary *this,ExternalMethod entryPoint,Var nameId,Var signature,UINT64 flags,
          bool isLengthAvailable)

{
  ThreadContext *this_00;
  bool bVar1;
  int32 propertyId;
  JavascriptExternalFunction *this_01;
  PropertyRecord *pPVar2;
  undefined3 in_register_00000089;
  
  this_01 = CreateIdMappedExternalFunction<void*(*)(Js::RecyclableObject*,Js::CallInfo,void**)>
                      (this,(_func_void_ptr_RecyclableObject_ptr_CallInfo_void_ptr_ptr *)entryPoint,
                       (&this->externalFunctionWithDeferredPrototypeType)
                       [CONCAT31(in_register_00000089,isLengthAvailable)].ptr);
  this_01->flags = flags;
  RuntimeFunction::SetFunctionNameId(&this_01->super_RuntimeFunction,nameId);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this_01->signature,signature);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,HostPhase);
  if (bVar1) {
    bVar1 = TaggedInt::Is(nameId);
    if (bVar1) {
      this_00 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
      propertyId = TaggedInt::ToInt32(nameId);
      pPVar2 = ThreadContext::GetPropertyName(this_00,propertyId);
      pPVar2 = pPVar2 + 1;
    }
    else {
      pPVar2 = (PropertyRecord *)JavascriptString::GetString((JavascriptString *)nameId);
    }
    Output::Print(L"Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"
                  ,this,nameId,pPVar2);
  }
  return this_01;
}

Assistant:

JavascriptExternalFunction*
    JavascriptLibrary::CreateExternalFunction(ExternalMethod entryPoint, Var nameId, Var signature, UINT64 flags, bool isLengthAvailable)
    {
        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(entryPoint, isLengthAvailable ? externalFunctionWithLengthAndDeferredPrototypeType : externalFunctionWithDeferredPrototypeType);
        function->SetExternalFlags(flags);
        function->SetFunctionNameId(nameId);
        function->SetSignature(signature);
#ifdef HEAP_ENUMERATION_VALIDATION
        function->SetHeapEnumValidationCookie(HEAP_ENUMERATION_LIBRARY_OBJECT_COOKIE);
#endif

        JS_ETW_INTERNAL(EventWriteJSCRIPT_BUILD_DIRECT_FUNCTION(scriptContext, function, TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString()));
#if DBG_DUMP
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostPhase))
        {
            Output::Print(_u("Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"),
                this, nameId,
                TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString());
        }
#endif
        return function;
    }